

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O0

void duckdb::BitpackingPrimitives::PackBuffer<long,false>
               (data_ptr_t dst,long *src,idx_t count,bitpacking_width_t width)

{
  ulong uVar1;
  ulong in_RDX;
  long in_RSI;
  long tmp_buffer [32];
  idx_t i;
  idx_t misaligned_count;
  long *in_stack_fffffffffffffec8;
  data_ptr_t in_stack_fffffffffffffed0;
  ulong local_30;
  
  uVar1 = in_RDX & 0x1f;
  for (local_30 = 0; local_30 < in_RDX - uVar1; local_30 = local_30 + 0x20) {
    PackGroup<long>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,'\0');
  }
  if (uVar1 != 0) {
    memset(&stack0xfffffffffffffec8,0,0x100);
    memcpy(&stack0xfffffffffffffec8,(void *)(in_RSI + (in_RDX - uVar1) * 8),uVar1 << 3);
    PackGroup<long>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,'\0');
  }
  return;
}

Assistant:

inline static void PackBuffer(data_ptr_t dst, T *src, idx_t count, bitpacking_width_t width) {
		if (ASSUME_INPUT_ALIGNED) {
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}
		} else {
			idx_t misaligned_count = count % BITPACKING_ALGORITHM_GROUP_SIZE;
			count -= misaligned_count;
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}

			// The input is not aligned to BITPACKING_ALGORITHM_GROUP_SIZE.
			// Copy the unaligned count into a zero-initialized temporary group, and pack it.
			if (misaligned_count) {
				T tmp_buffer[BITPACKING_ALGORITHM_GROUP_SIZE] = {0};
				memcpy(tmp_buffer, src + count, misaligned_count * sizeof(T));
				PackGroup<T>(dst + (count * width) / 8, tmp_buffer, width);
			}
		}
	}